

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O1

void aom_dc_predictor_64x16_avx2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  int iVar7;
  uint8_t *puVar8;
  uint8_t uVar9;
  
  auVar5 = vpsadbw_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),*(undefined1 (*) [32])above);
  auVar6 = vpsadbw_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),
                        *(undefined1 (*) [32])(above + 0x20));
  auVar5 = vpaddq_avx2(auVar6,auVar5);
  auVar1 = vpaddq_avx(auVar5._16_16_,auVar5._0_16_);
  auVar3 = vpshufd_avx(auVar1,0xee);
  auVar2 = vpsadbw_avx((undefined1  [16])0x0,*(undefined1 (*) [16])left);
  auVar4 = vpshufd_avx(auVar2,0xee);
  auVar2 = vpaddw_avx(auVar4,auVar2);
  auVar2 = vpaddw_avx(auVar1,auVar2);
  auVar2 = vpaddw_avx(auVar3,auVar2);
  uVar9 = (uint8_t)((auVar2._0_4_ + 0x28U & 0xfff0) / 0x50);
  puVar8 = dst + 0x20;
  iVar7 = 0x10;
  do {
    puVar8[-0x20] = uVar9;
    puVar8[-0x1f] = uVar9;
    puVar8[-0x1e] = uVar9;
    puVar8[-0x1d] = uVar9;
    puVar8[-0x1c] = uVar9;
    puVar8[-0x1b] = uVar9;
    puVar8[-0x1a] = uVar9;
    puVar8[-0x19] = uVar9;
    puVar8[-0x18] = uVar9;
    puVar8[-0x17] = uVar9;
    puVar8[-0x16] = uVar9;
    puVar8[-0x15] = uVar9;
    puVar8[-0x14] = uVar9;
    puVar8[-0x13] = uVar9;
    puVar8[-0x12] = uVar9;
    puVar8[-0x11] = uVar9;
    puVar8[-0x10] = uVar9;
    puVar8[-0xf] = uVar9;
    puVar8[-0xe] = uVar9;
    puVar8[-0xd] = uVar9;
    puVar8[-0xc] = uVar9;
    puVar8[-0xb] = uVar9;
    puVar8[-10] = uVar9;
    puVar8[-9] = uVar9;
    puVar8[-8] = uVar9;
    puVar8[-7] = uVar9;
    puVar8[-6] = uVar9;
    puVar8[-5] = uVar9;
    puVar8[-4] = uVar9;
    puVar8[-3] = uVar9;
    puVar8[-2] = uVar9;
    puVar8[-1] = uVar9;
    *puVar8 = uVar9;
    puVar8[1] = uVar9;
    puVar8[2] = uVar9;
    puVar8[3] = uVar9;
    puVar8[4] = uVar9;
    puVar8[5] = uVar9;
    puVar8[6] = uVar9;
    puVar8[7] = uVar9;
    puVar8[8] = uVar9;
    puVar8[9] = uVar9;
    puVar8[10] = uVar9;
    puVar8[0xb] = uVar9;
    puVar8[0xc] = uVar9;
    puVar8[0xd] = uVar9;
    puVar8[0xe] = uVar9;
    puVar8[0xf] = uVar9;
    puVar8[0x10] = uVar9;
    puVar8[0x11] = uVar9;
    puVar8[0x12] = uVar9;
    puVar8[0x13] = uVar9;
    puVar8[0x14] = uVar9;
    puVar8[0x15] = uVar9;
    puVar8[0x16] = uVar9;
    puVar8[0x17] = uVar9;
    puVar8[0x18] = uVar9;
    puVar8[0x19] = uVar9;
    puVar8[0x1a] = uVar9;
    puVar8[0x1b] = uVar9;
    puVar8[0x1c] = uVar9;
    puVar8[0x1d] = uVar9;
    puVar8[0x1e] = uVar9;
    puVar8[0x1f] = uVar9;
    puVar8 = puVar8 + stride;
    iVar7 = iVar7 + -1;
  } while (iVar7 != 0);
  return;
}

Assistant:

static inline __m256i dc_sum_64(const uint8_t *ref) {
  const __m256i x0 = _mm256_loadu_si256((const __m256i *)ref);
  const __m256i x1 = _mm256_loadu_si256((const __m256i *)(ref + 32));
  const __m256i zero = _mm256_setzero_si256();
  __m256i y0 = _mm256_sad_epu8(x0, zero);
  __m256i y1 = _mm256_sad_epu8(x1, zero);
  y0 = _mm256_add_epi64(y0, y1);
  __m256i u0 = _mm256_permute2x128_si256(y0, y0, 1);
  y0 = _mm256_add_epi64(u0, y0);
  u0 = _mm256_unpackhi_epi64(y0, y0);
  return _mm256_add_epi16(y0, u0);
}